

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

void __thiscall QAccessibleButton::doAction(QAccessibleButton *this,QString *actionName)

{
  bool bVar1;
  QWidget *pQVar2;
  QString *pQVar3;
  QObject *object;
  QPushButton *this_00;
  QMenu *pQVar4;
  QAbstractButton *pQVar5;
  
  pQVar2 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  if ((pQVar2->data->widget_attributes & 1) != 0) {
    return;
  }
  pQVar3 = (QString *)QAccessibleActionInterface::pressAction();
  bVar1 = ::comparesEqual(actionName,pQVar3);
  if (!bVar1) {
    pQVar3 = (QString *)QAccessibleActionInterface::showMenuAction();
    bVar1 = ::comparesEqual(actionName,pQVar3);
    if (!bVar1) {
      pQVar3 = (QString *)QAccessibleActionInterface::toggleAction();
      bVar1 = ::comparesEqual(actionName,pQVar3);
      if (bVar1) {
        pQVar5 = button(this);
        QAbstractButton::toggle(pQVar5);
        return;
      }
      QAccessibleWidget::doAction(&this->super_QAccessibleWidget,actionName);
      return;
    }
  }
  object = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  this_00 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>(object);
  if (this_00 != (QPushButton *)0x0) {
    pQVar4 = QPushButton::menu(this_00);
    if (pQVar4 != (QMenu *)0x0) {
      QPushButton::showMenu(this_00);
      return;
    }
  }
  pQVar5 = button(this);
  QAbstractButton::animateClick(pQVar5);
  return;
}

Assistant:

void QAccessibleButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;
    if (actionName == pressAction() ||
        actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->menu())
            pb->showMenu();
        else
#endif
            button()->animateClick();
    } else if (actionName == toggleAction()) {
        button()->toggle();
    } else {
        QAccessibleWidget::doAction(actionName);
    }
}